

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O3

int create_mq(void)

{
  int iVar1;
  
  client_once(0);
  iVar1 = generate_key("mq");
  iVar1 = msgget(iVar1,0x1b6);
  if (iVar1 != -1) {
    return iVar1;
  }
  throw("Error retrieving message-queue on client-side");
}

Assistant:

int create_mq() {
	int mq;
	key_t key;

	client_once(WAIT);

	// Generate a key for the message-queue
	key = generate_key("mq");

	// msgget is the call to create or retrieve a message queue.
	// It is identified by its unique key, which we generated above
	// and which we pass as first argument. 0666 are the
	// read+write permissions for user, group and world.
	if ((mq = msgget(key, 0666)) == -1) {
		throw("Error retrieving message-queue on client-side");
	}

	return mq;
}